

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_triangle_mesh.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::TriangleMeshISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,TriangleMeshISA *this,PrimRef *prims,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  BufferView<embree::Vec3fa> *pBVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  undefined4 uVar9;
  long lVar10;
  ulong uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  long lVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  undefined1 auVar24 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar12 = r->_begin;
  sVar7 = 0;
  aVar15 = _DAT_01f45a40;
  aVar16 = _DAT_01f45a30;
  aVar17 = _DAT_01f45a40;
  aVar18 = _DAT_01f45a30;
  do {
    if (r->_end <= uVar12) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = aVar18;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = aVar17;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = aVar16;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = aVar15;
      __return_storage_ptr__->end = sVar7;
      return __return_storage_ptr__;
    }
    lVar10 = *(long *)&(this->super_TriangleMesh).super_Geometry.field_0x58;
    pBVar2 = (this->super_TriangleMesh).vertices.items;
    lVar14 = *(long *)&(this->super_TriangleMesh).field_0x68 * uVar12;
    uVar11 = (ulong)*(uint *)(lVar10 + lVar14);
    uVar3 = (pBVar2->super_RawBufferView).num;
    if (((uVar11 < uVar3) && (uVar8 = (ulong)*(uint *)(lVar10 + 4 + lVar14), uVar8 < uVar3)) &&
       (uVar13 = (ulong)*(uint *)(lVar10 + 8 + lVar14), uVar13 < uVar3)) {
      lVar10 = 0;
      do {
        if ((ulong)(this->super_TriangleMesh).super_Geometry.numTimeSteps * 0x38 + 0x38 ==
            lVar10 + 0x38) {
          pcVar5 = (this->super_TriangleMesh).vertices0.super_RawBufferView.ptr_ofs;
          sVar6 = (this->super_TriangleMesh).vertices0.super_RawBufferView.stride;
          auVar21 = minps(*(undefined1 (*) [16])(pcVar5 + uVar11 * sVar6),
                          *(undefined1 (*) [16])(pcVar5 + uVar8 * sVar6));
          auVar22 = minps(auVar21,*(undefined1 (*) [16])(pcVar5 + uVar13 * sVar6));
          auVar21 = maxps(*(undefined1 (*) [16])(pcVar5 + uVar11 * sVar6),
                          *(undefined1 (*) [16])(pcVar5 + uVar8 * sVar6));
          auVar21 = maxps(auVar21,*(undefined1 (*) [16])(pcVar5 + uVar13 * sVar6));
          aVar23._0_12_ = auVar22._0_12_;
          aVar23.m128[3] = (float)geomID;
          aVar20._0_12_ = auVar21._0_12_;
          aVar20.m128[3] = (float)uVar12;
          aVar18.m128 = (__m128)minps(aVar18.m128,aVar23.m128);
          aVar17.m128 = (__m128)maxps(aVar17.m128,aVar20.m128);
          prims[k].lower.field_0 = aVar23;
          auVar24._0_4_ = auVar22._0_4_ + auVar21._0_4_;
          auVar24._4_4_ = auVar22._4_4_ + auVar21._4_4_;
          auVar24._8_4_ = auVar22._8_4_ + auVar21._8_4_;
          auVar24._12_4_ = (float)geomID + (float)uVar12;
          aVar16.m128 = (__m128)minps(aVar16.m128,auVar24);
          aVar15.m128 = (__m128)maxps(aVar15.m128,auVar24);
          sVar7 = sVar7 + 1;
          prims[k].upper.field_0 = aVar20;
          k = k + 1;
          break;
        }
        lVar14 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar10);
        lVar4 = *(long *)((long)&(pBVar2->super_RawBufferView).stride + lVar10);
        pfVar1 = (float *)(lVar14 + lVar4 * uVar11);
        auVar21._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar21._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar21._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar21._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar9 = movmskps((int)(lVar4 * uVar11),auVar21);
        if ((~(byte)uVar9 & 7) != 0) break;
        pfVar1 = (float *)(lVar14 + lVar4 * uVar8);
        auVar22._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar22._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar22._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar22._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar9 = movmskps((int)(lVar4 * uVar8),auVar22);
        if ((~(byte)uVar9 & 7) != 0) break;
        pfVar1 = (float *)(lVar14 + lVar4 * uVar13);
        auVar19._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar19._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar19._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar19._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar9 = movmskps((int)(lVar4 * uVar13),auVar19);
        lVar10 = lVar10 + 0x38;
      } while ((~(byte)uVar9 & 7) == 0);
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,&bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }